

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O3

int pk_write_ec_private(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  int iVar1;
  ulong buflen;
  uchar tmp [66];
  uchar auStack_68 [72];
  
  buflen = (ec->grp).pbits + 7 >> 3;
  iVar1 = mbedtls_mpi_write_binary(&ec->d,auStack_68,buflen);
  if (iVar1 == 0) {
    iVar1 = mbedtls_asn1_write_octet_string(p,start,auStack_68,buflen);
  }
  mbedtls_platform_zeroize(auStack_68,buflen);
  return iVar1;
}

Assistant:

static int pk_write_ec_private( unsigned char **p, unsigned char *start,
                                mbedtls_ecp_keypair *ec )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t byte_length = ( ec->grp.pbits + 7 ) / 8;
    unsigned char tmp[MBEDTLS_ECP_MAX_BYTES];

    ret = mbedtls_mpi_write_binary( &ec->d, tmp, byte_length );
    if( ret != 0 )
        goto exit;
    ret = mbedtls_asn1_write_octet_string( p, start, tmp, byte_length );

exit:
    mbedtls_platform_zeroize( tmp, byte_length );
    return( ret );
}